

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup>::
emplaceRealloc<slang::ast::CaseAssertionExpr::ItemGroup>
          (SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup> *this,pointer pos,
          ItemGroup *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator pIVar3;
  ItemGroup *__result;
  ItemGroup *pIVar4;
  iterator __first;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  ItemGroup *args_local;
  pointer pos_local;
  SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup> *this_local;
  
  sVar1 = this->len;
  sVar2 = max_size(this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = calculateGrowth(this,this->len + 1);
  pIVar3 = begin(this);
  __result = (ItemGroup *)slang::detail::allocArray(capacity,0x18);
  pIVar4 = __result + ((long)pos - (long)pIVar3) / 0x18;
  (pIVar4->expressions).data_ = (args->expressions).data_;
  (pIVar4->expressions).size_ = (args->expressions).size_;
  (pIVar4->body).ptr = (args->body).ptr;
  pIVar3 = end(this);
  if (pos == pIVar3) {
    __first = begin(this);
    pIVar3 = end(this);
    std::
    uninitialized_move<slang::ast::CaseAssertionExpr::ItemGroup*,slang::ast::CaseAssertionExpr::ItemGroup*>
              (__first,pIVar3,__result);
  }
  else {
    pIVar3 = begin(this);
    std::
    uninitialized_move<slang::ast::CaseAssertionExpr::ItemGroup*,slang::ast::CaseAssertionExpr::ItemGroup*>
              (pIVar3,pos,__result);
    pIVar3 = end(this);
    std::
    uninitialized_move<slang::ast::CaseAssertionExpr::ItemGroup*,slang::ast::CaseAssertionExpr::ItemGroup*>
              (pos,pIVar3,pIVar4 + 1);
  }
  cleanup(this,(EVP_PKEY_CTX *)pIVar3);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = __result;
  return pIVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}